

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  bool bVar1;
  string dot_extension;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".",&local_79);
  std::operator+(&local_78,&local_38,extension);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = String::EndsWithCaseInsensitive(&this->pathname_,&local_78);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)this);
    FilePath(__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(
        pathname_.substr(0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}